

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void sysbvm_heap_checkForGCThreshold(sysbvm_heap_t *heap)

{
  sysbvm_heap_t *heap_local;
  
  if ((heap->shouldAttemptToCollect & 1U) == 0) {
    heap->shouldAttemptToCollect = heap->nextGCSizeThreshold < heap->totalSize;
  }
  return;
}

Assistant:

static void sysbvm_heap_checkForGCThreshold(sysbvm_heap_t *heap)
{
    if(heap->shouldAttemptToCollect)
        return;

    // Monitor for GC collection threshold.
    heap->shouldAttemptToCollect = heap->totalSize > heap->nextGCSizeThreshold;
    //if(heap->shouldAttemptToCollect)
    //    printf("heap->shouldAttemptToCollect %zu > %zu | %zu\n", heap->totalSize, heap->nextGCSizeThreshold, heap->totalCapacity);
}